

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.h
# Opt level: O0

void __thiscall iqxmlrpc::Date_time::~Date_time(Date_time *this)

{
  Date_time *this_local;
  
  ~Date_time(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

class LIBIQXMLRPC_API Date_time: public Value_type {
public:
  //! Malformed dateTime.iso8601 format exception.
  class Malformed_iso8601: public Exception {
  public:
    Malformed_iso8601():
      Exception( "Malformed date-time format." ) {}
  };

private:
  struct tm tm_;
  mutable std::string cache;

public:
  Date_time( const struct tm* );
  explicit Date_time( const std::string& dateTime_iso8601 );
  explicit Date_time( bool localtime );

  const struct tm& get_tm() const { return tm_; }
  const std::string& to_string() const;

  Value_type* clone() const;
  const std::string& type_name() const;
  void apply_visitor(Value_type_visitor&) const;
}